

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::ClearWindowSettings(char *name)

{
  byte *pbVar1;
  ImGuiID id;
  ImGuiWindow *window;
  ImGuiWindowSettings *pIVar2;
  
  window = FindWindowByName(name);
  if (window == (ImGuiWindow *)0x0) {
    id = ImHashStr(name,0,0);
    pIVar2 = FindWindowSettingsByID(id);
  }
  else {
    pbVar1 = (byte *)((long)&window->Flags + 1);
    *pbVar1 = *pbVar1 | 1;
    InitOrLoadWindowSettings(window,(ImGuiWindowSettings *)0x0);
    pIVar2 = FindWindowSettingsByWindow(window);
  }
  if (pIVar2 != (ImGuiWindowSettings *)0x0) {
    pIVar2->WantDelete = true;
  }
  return;
}

Assistant:

void ImGui::ClearWindowSettings(const char* name)
{
    //IMGUI_DEBUG_LOG("ClearWindowSettings('%s')\n", name);
    ImGuiWindow* window = FindWindowByName(name);
    if (window != NULL)
    {
        window->Flags |= ImGuiWindowFlags_NoSavedSettings;
        InitOrLoadWindowSettings(window, NULL);
    }
    if (ImGuiWindowSettings* settings = window ? FindWindowSettingsByWindow(window) : FindWindowSettingsByID(ImHashStr(name)))
        settings->WantDelete = true;
}